

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O2

idx_t __thiscall
duckdb::BatchedDataCollection::IndexToBatchIndex(BatchedDataCollection *this,idx_t index)

{
  InternalException *this_00;
  difference_type __d;
  allocator local_41;
  const_iterator entry;
  
  if (index < (this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    entry._M_node = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ::std::
    __advance<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>,long>
              (&entry,index);
    return *(idx_t *)(entry._M_node + 1);
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&entry,
             "Index %d is out of range for this collection, it only contains %d batches",&local_41);
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_00,(string *)&entry,index,
             (this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t BatchedDataCollection::IndexToBatchIndex(idx_t index) const {
	if (index >= data.size()) {
		throw InternalException("Index %d is out of range for this collection, it only contains %d batches", index,
		                        data.size());
	}
	auto entry = data.begin();
	std::advance(entry, index);
	return entry->first;
}